

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O3

void gravity_lexer_skip_line(gravity_lexer_t *lexer)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char cVar8;
  uint32_t uVar9;
  ulong uVar10;
  undefined8 uStack_28;
  
  uVar10 = (ulong)lexer->offset;
  if (lexer->offset < lexer->length) {
    uStack_28 = uVar10;
    do {
      lexer->offset = (int)uVar10 + 1;
      cVar8 = lexer->buffer[uVar10];
      lexer->position = lexer->position + 1;
      lexer->colno = lexer->colno + 1;
      uVar2 = (lexer->token).bytes;
      uVar5 = (lexer->token).length;
      (lexer->token).bytes = uVar2 + 1;
      (lexer->token).length = uVar5 + 1;
      uStack_28 = CONCAT17(cVar8,(undefined7)uStack_28);
      uVar9 = utf8_charbytes((char *)((long)&uStack_28 + 7),0);
      switch(uVar9) {
      case 0:
        goto switchD_00115b1d_caseD_0;
      case 2:
        lexer->offset = lexer->offset + 1;
        lexer->colno = lexer->colno + 1;
        puVar1 = &(lexer->token).bytes;
        *puVar1 = *puVar1 + 1;
        break;
      case 3:
        lexer->offset = lexer->offset + 2;
        lexer->colno = lexer->colno + 2;
        puVar1 = &(lexer->token).bytes;
        *puVar1 = *puVar1 + 2;
        break;
      case 4:
        lexer->colno = lexer->colno + 3;
        uVar3 = lexer->offset;
        uVar6 = lexer->position;
        lexer->offset = uVar3 + 3;
        lexer->position = uVar6 + 1;
        uVar4 = (lexer->token).bytes;
        uVar7 = (lexer->token).length;
        (lexer->token).bytes = uVar4 + 3;
        (lexer->token).length = uVar7 + 1;
      }
      if (cVar8 == '\n') {
LAB_00115b8c:
        lexer->lineno = lexer->lineno + 1;
        lexer->colno = 1;
        return;
      }
      if (cVar8 == '\r') {
        if (lexer->buffer[lexer->offset] == '\n') {
          lexer->offset = lexer->offset + 1;
          lexer->position = lexer->position + 1;
        }
        goto LAB_00115b8c;
      }
switchD_00115b1d_caseD_0:
      uVar10 = (ulong)lexer->offset;
    } while (lexer->offset < lexer->length);
  }
  return;
}

Assistant:

void gravity_lexer_skip_line (gravity_lexer_t *lexer) {
    while (!IS_EOF) {
        int c = 0;
        next_utf8(lexer, &c);
        if (is_newline(lexer, c)) {
            INC_LINE;
            break;
        }
    }
}